

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadtree.c
# Opt level: O0

void SplitTree(QuadTreeNode *Tree)

{
  undefined8 *puVar1;
  long in_RDI;
  int c;
  Container *PNext;
  Container *P;
  int local_1c;
  QuadTreeNode *in_stack_fffffffffffffff0;
  undefined8 *puVar2;
  
  local_1c = 4;
  if (*(long *)(in_RDI + 0x38) == 0) {
    if (*(long *)(in_RDI + 0x28) != 0) {
      puVar2 = *(undefined8 **)(in_RDI + 0x28);
      *(undefined8 *)(in_RDI + 0x30) = 0;
      *(undefined8 *)(in_RDI + 0x28) = 0;
      while (puVar2 != (undefined8 *)0x0) {
        puVar1 = (undefined8 *)*puVar2;
        if (*(int *)(puVar2 + 1) == 1) {
          if ((*(uint *)(puVar2[2] + 0x38) & 0x200) == 0) {
            *puVar2 = *(undefined8 *)(in_RDI + 0x28);
            *(undefined8 **)(in_RDI + 0x28) = puVar2;
            puVar2 = puVar1;
          }
          else {
            *puVar2 = *(undefined8 *)(in_RDI + 0x30);
            *(undefined8 **)(in_RDI + 0x30) = puVar2;
            puVar2 = puVar1;
          }
        }
        else if (((*(uint *)(puVar2[2] + 0x48) | *(uint *)(puVar2[2] + 0x4c) |
                  *(uint *)(puVar2[2] + 0x50)) & 0x200) == 0) {
          *puVar2 = *(undefined8 *)(in_RDI + 0x28);
          *(undefined8 **)(in_RDI + 0x28) = puVar2;
          puVar2 = puVar1;
        }
        else {
          *puVar2 = *(undefined8 *)(in_RDI + 0x30);
          *(undefined8 **)(in_RDI + 0x30) = puVar2;
          puVar2 = puVar1;
        }
      }
    }
  }
  else {
    while (local_1c != 0) {
      SplitTree(in_stack_fffffffffffffff0);
      local_1c = local_1c + -1;
    }
  }
  return;
}

Assistant:

void SplitTree(struct QuadTreeNode *Tree)
{
   struct Container *P, *PNext;
   int c = 4;

   if (Tree->Children) {
      while (c--)
         SplitTree(&Tree->Children[c]);
   } else if (Tree->Contents) {
      P = Tree->Contents;
      Tree->Contents = Tree->PostContents = NULL;

      while (P) {
         PNext = P->Next;

         if (P->Type == OBJECT) {
            if (P->Content.O->Flags & FLAGS_FOREGROUND) {
               P->Next = Tree->PostContents;
               Tree->PostContents = P;
            } else {
               P->Next = Tree->Contents;
               Tree->Contents = P;
            }
         } else {
            if ((P->Content.T->EdgeFlags[0] | P->Content.T->
                 EdgeFlags[1] | P->Content.T->EdgeFlags[2])
                & FLAGS_FOREGROUND) {
               P->Next = Tree->PostContents;
               Tree->PostContents = P;
            } else {
               P->Next = Tree->Contents;
               Tree->Contents = P;
            }
         }

         P = PNext;
      }
   }
}